

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

WeakArenaReference<Js::IDiagObjectModelWalkerBase> * __thiscall
Js::RecyclableCollectionObjectDisplay<Js::JavascriptSet>::CreateWalker
          (RecyclableCollectionObjectDisplay<Js::JavascriptSet> *this)

{
  LONG *pLVar1;
  RecyclableCollectionObjectWalker<Js::JavascriptSet> *pRVar2;
  ReferencedArenaAdapter *pRVar3;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *pWVar4;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if ((this->walker != (RecyclableCollectionObjectWalker<Js::JavascriptSet> *)0x0) &&
     (pRVar3 = DebugManager::GetDiagnosticArena(this->scriptContext->threadContext->debugManager),
     pRVar3 != (ReferencedArenaAdapter *)0x0)) {
    local_40 = (undefined1  [8])
               &Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_3d84632;
    data.filename._0_4_ = 0xe33;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_40);
    pWVar4 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)
             new<Memory::HeapAllocator>(0x10,alloc,0x300d4a);
    pRVar2 = this->walker;
    pWVar4->adapter = pRVar3;
    pWVar4->p = &pRVar2->super_IDiagObjectModelWalkerBase;
    LOCK();
    pLVar1 = &(pRVar3->super_RefCounted).refCount;
    *pLVar1 = *pLVar1 + 1;
    UNLOCK();
    return pWVar4;
  }
  return (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* RecyclableCollectionObjectDisplay<TData>::CreateWalker()
    {
        if (walker)
        {
            ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
            if (pRefArena)
            {
                return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>, pRefArena, walker);
            }
        }
        return nullptr;
    }